

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O2

char * efsw_getlasterror(void)

{
  int iVar1;
  string asStack_28 [32];
  
  if (efsw_getlasterror::log_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&efsw_getlasterror::log_str_abi_cxx11_);
    if (iVar1 != 0) {
      efsw_getlasterror::log_str_abi_cxx11_._M_dataplus._M_p =
           (pointer)&efsw_getlasterror::log_str_abi_cxx11_.field_2;
      efsw_getlasterror::log_str_abi_cxx11_._M_string_length = 0;
      efsw_getlasterror::log_str_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&efsw_getlasterror::log_str_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&efsw_getlasterror::log_str_abi_cxx11_);
    }
  }
  efsw::Errors::Log::getLastErrorLog_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&efsw_getlasterror::log_str_abi_cxx11_,asStack_28);
  std::__cxx11::string::~string(asStack_28);
  return efsw_getlasterror::log_str_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* efsw_getlasterror()
{
	static std::string log_str;
	log_str = efsw::Errors::Log::getLastErrorLog();
	return log_str.c_str();
}